

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O3

Am_Value compute_mg_start_when_proc(Am_Object *self)

{
  long lVar1;
  ushort uVar2;
  bool bVar3;
  Am_Value *pAVar4;
  Am_Wrapper *initial;
  ushort uVar5;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Slot_Key in_SI;
  Am_Value AVar6;
  Am_Input_Char local_5c;
  Am_Value_List char_list;
  Am_Object widget;
  Am_Value local_40;
  
  Am_Object::Get_Object(&widget,in_SI,10);
  bVar3 = Am_Object::Valid(&widget);
  if (bVar3) {
    Am_Input_Char::Am_Input_Char(&local_5c,0,false,false,false,Am_NEITHER,Am_NOT_MOUSE,false);
    get_owner_start_and_convert_string((Am_Object *)&char_list);
    Am_Value_List::Start(&char_list);
    while( true ) {
      bVar3 = Am_Value_List::Last(&char_list);
      if (bVar3) break;
      pAVar4 = Am_Value_List::Get(&char_list);
      lVar1 = (pAVar4->value).long_value;
      if ((lVar1 != 0) && (pAVar4->type != Am_Input_Char::Am_Input_Char_ID)) {
        Am_Error();
      }
      local_5c.code = (short)lVar1;
      uVar2 = (ushort)((ulong)lVar1 >> 0x10);
      uVar5 = 0xfff6;
      if ((uVar2 & 0xf0) == 0x30) {
        uVar5 = 0xff16;
      }
      uVar5 = uVar5 & (uVar2 & 0xff6 | local_5c._2_2_ & 0xf000);
      local_5c._2_2_ = uVar5 & 0xf1f6;
      if (((uint)((ulong)lVar1 >> 0x10) & 0xf00) != 0x700) {
        local_5c._2_2_ = uVar5;
      }
      Am_Input_Char::operator_cast_to_Am_Value(&local_5c);
      Am_Value_List::Set(&char_list,&local_40,true);
      Am_Value::~Am_Value(&local_40);
      Am_Value_List::Next(&char_list);
    }
    initial = Am_Value_List::operator_cast_to_Am_Wrapper_(&char_list);
    Am_Value::Am_Value((Am_Value *)self,initial);
    Am_Value_List::~Am_Value_List(&char_list);
  }
  else {
    Am_Input_Char::Am_Input_Char((Am_Input_Char *)&char_list,"LEFT_DOWN",true);
    Am_Input_Char::operator_cast_to_Am_Value((Am_Input_Char *)&char_list);
  }
  Am_Object::~Am_Object(&widget);
  AVar6.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar6._0_8_ = self;
  return AVar6;
}

Assistant:

Am_Define_Formula(Am_Value, compute_mg_start_when)
{
  Am_Object widget = self.Get_Owner();
  if (widget.Valid()) {
    Am_Input_Char parent_char;
    Am_Value_List char_list = get_owner_start_and_convert_string(widget);
    for (char_list.Start(); !char_list.Last(); char_list.Next()) {
      parent_char = (Am_Input_Char)char_list.Get();
      parent_char.any_modifier = false;
      parent_char.shift = false;
      if (parent_char.button_down == Am_ANY_DOWN_UP)
        parent_char.button_down = Am_BUTTON_DOWN;
      if (parent_char.click_count == Am_ANY_CLICK)
        parent_char.click_count = Am_SINGLE_CLICK;
      //std::cout << "computed start when " << parent_char << " from widget " <<
      //  widget <<std::endl <<std::flush;
      char_list.Set(parent_char);
    }
    return Am_Value(char_list);
  } else
    return Am_Input_Char("LEFT_DOWN");
}